

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O0

void value_suite::fail_long_double_as_array(void)

{
  error_code eVar1;
  int local_78 [2];
  error_category *local_70;
  type local_60;
  undefined1 local_48 [8];
  error_code error;
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            ((basic_variable<std::allocator<char>_> *)&error._M_cat,(longdouble)0);
  std::error_code::error_code((error_code *)local_48);
  trial::dynamic::basic_variable<std::allocator<char>>::
  value<trial::dynamic::basic_array<std::allocator<char>>>
            (&local_60,(basic_variable<std::allocator<char>> *)&error._M_cat,(error_code *)local_48)
  ;
  std::
  vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  ::~vector(&local_60);
  eVar1 = trial::dynamic::make_error_code(incompatible_type);
  local_70 = eVar1._M_cat;
  local_78[0] = eVar1._M_value;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::error_code,std::error_code>
            ("error","make_error_code(incompatible_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1733,"void value_suite::fail_long_double_as_array()",local_48,local_78);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&error._M_cat);
  return;
}

Assistant:

void fail_long_double_as_array()
{
    variable data(0.0L);
    std::error_code error;
    data.value<array>(error);
    TRIAL_PROTOCOL_TEST_EQUAL(error, make_error_code(incompatible_type));
}